

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaDemuxer.cpp
# Opt level: O2

string * METADemuxer::mplsTrackToFullName
                   (string *__return_storage_ptr__,string *mplsFileName,string *mplsNum)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  allocator<char> local_e1;
  string m2tsExt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string mplsExt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  extractFilePath(&mplsExt,mplsFileName);
  toNativeSeparators(&path,&mplsExt);
  std::__cxx11::string::~string((string *)&mplsExt);
  cVar2 = getDirSeparator();
  lVar4 = std::__cxx11::string::rfind((char)&path,(ulong)(uint)(int)cVar2);
  if (lVar4 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::substr((ulong)&local_c0,(ulong)&path);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"STREAM",(allocator<char> *)&local_40);
    std::operator+(&m2tsExt,&local_c0,&local_80);
    cVar2 = getDirSeparator();
    std::operator+(&mplsExt,&m2tsExt,cVar2);
    std::__cxx11::string::operator=((string *)&path,(string *)&mplsExt);
    std::__cxx11::string::~string((string *)&mplsExt);
    std::__cxx11::string::~string((string *)&m2tsExt);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_c0);
    extractFileExt(&m2tsExt,mplsFileName);
    strToLowerCase(&mplsExt,&m2tsExt);
    std::__cxx11::string::~string((string *)&m2tsExt);
    bVar3 = std::operator==(&mplsExt,"mpls");
    pcVar1 = ".mts";
    if (bVar3) {
      pcVar1 = ".m2ts";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&m2tsExt,pcVar1 + 1,(allocator<char> *)&local_c0);
    std::operator+(&local_80,&path,mplsNum);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,".",&local_e1);
    std::operator+(&local_c0,&local_80,&local_40);
    std::operator+(__return_storage_ptr__,&local_c0,&m2tsExt);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&m2tsExt);
    std::__cxx11::string::~string((string *)&mplsExt);
  }
  std::__cxx11::string::~string((string *)&path);
  return __return_storage_ptr__;
}

Assistant:

std::string METADemuxer::mplsTrackToFullName(const std::string& mplsFileName, const std::string& mplsNum)
{
    string path = toNativeSeparators(extractFilePath(mplsFileName));
    const size_t tmp = path.find_last_of(getDirSeparator());
    if (tmp == string::npos)
        return {};
    path = path.substr(0, tmp + 1) + string("STREAM") + getDirSeparator();

    const string mplsExt = strToLowerCase(extractFileExt(mplsFileName));
    const string m2tsExt = (mplsExt == "mpls") ? "m2ts" : "mts";

    return path + mplsNum + string(".") + m2tsExt;
}